

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O2

int WOPN_BanksCmp(WOPNFile *bank1,WOPNFile *bank2)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  uVar5 = 0;
  uVar6 = 0;
  if ((((bank1->version == bank2->version) && (bank1->lfo_freq == bank2->lfo_freq)) &&
      (uVar6 = uVar5, bank1->chip_type == bank2->chip_type)) &&
     (((bank1->volume_model == bank2->volume_model &&
       (uVar1 = bank1->banks_count_melodic, uVar1 == bank2->banks_count_melodic)) &&
      (uVar2 = bank1->banks_count_percussion, uVar2 == bank2->banks_count_percussion)))) {
    bVar3 = true;
    for (lVar7 = 0; (ulong)uVar1 * 0x2424 - lVar7 != 0; lVar7 = lVar7 + 0x2424) {
      iVar4 = bcmp(bank1->banks_melodic->bank_name + lVar7,bank2->banks_melodic->bank_name + lVar7,
                   0x2424);
      bVar3 = (bool)(bVar3 & iVar4 == 0);
    }
    if (bVar3) {
      uVar6 = 1;
      for (lVar7 = 0; (ulong)uVar2 * 0x2424 - lVar7 != 0; lVar7 = lVar7 + 0x2424) {
        iVar4 = bcmp(bank1->banks_percussive->bank_name + lVar7,
                     bank2->banks_percussive->bank_name + lVar7,0x2424);
        uVar6 = uVar6 & iVar4 == 0;
      }
    }
    else {
      uVar6 = 0;
    }
  }
  return uVar6;
}

Assistant:

int WOPN_BanksCmp(const WOPNFile *bank1, const WOPNFile *bank2)
{
    int res = 1;

    res &= (bank1->version == bank2->version);
    res &= (bank1->lfo_freq == bank2->lfo_freq);
    res &= (bank1->chip_type == bank2->chip_type);
    res &= (bank1->volume_model == bank2->volume_model);
    res &= (bank1->banks_count_melodic == bank2->banks_count_melodic);
    res &= (bank1->banks_count_percussion == bank2->banks_count_percussion);

    if(res)
    {
        int i;
        for(i = 0; i < bank1->banks_count_melodic; i++)
            res &= (memcmp(&bank1->banks_melodic[i], &bank2->banks_melodic[i], sizeof(WOPNBank)) == 0);
        if(res)
        {
            for(i = 0; i < bank1->banks_count_percussion; i++)
                res &= (memcmp(&bank1->banks_percussive[i], &bank2->banks_percussive[i], sizeof(WOPNBank)) == 0);
        }
    }

    return res;
}